

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O0

void __thiscall WavingSketch<8U,_16U,_4U>::Init(WavingSketch<8U,_16U,_4U> *this,Data<4U> *item)

{
  Data<4U> *in_RDI;
  bool *in_stack_00000008;
  uint32_t in_stack_00000010;
  bool is_empty;
  uint32_t bucket_pos;
  uint in_stack_ffffffffffffffdc;
  
  Data<4U>::Hash(in_RDI,in_stack_ffffffffffffffdc);
  Bucket::Insert((Bucket *)this,item,bucket_pos,in_stack_00000010,in_stack_00000008);
  *(undefined4 *)in_RDI[0x28].str = *(undefined4 *)in_RDI[0x28].str;
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& item) {
		uint32_t bucket_pos = item.Hash(seed_choice) % BUCKET_NUM;
		bool is_empty = 0;
		buckets[bucket_pos].Insert(item, seed_s, seed_incast, is_empty);
		cnt += is_empty;
	}